

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wire.cpp
# Opt level: O1

double CWire::GetSegmentListCost(vector<CSegment_*,_std::allocator<CSegment_*>_> *pSegmentList)

{
  pointer ppCVar1;
  pointer ppCVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  
  if (pSegmentList == (vector<CSegment_*,_std::allocator<CSegment_*>_> *)0x0) {
LAB_0011f2a8:
    __assert_fail("pSegmentList",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                  ,0x275,"static double CWire::GetSegmentListCost(vector<CSegment *> *)");
  }
  iVar3 = (int)(CObject::m_pDesign->super_CBBox).m_cMaxZ -
          (int)(CObject::m_pDesign->super_CBBox).m_cMinZ;
  ppCVar1 = (pSegmentList->super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppCVar2 = (pSegmentList->super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  lVar5 = (long)ppCVar2 - (long)ppCVar1 >> 3;
  uVar4 = (uint)lVar5;
  if ((int)uVar4 < 1) {
    iVar6 = 1;
  }
  else {
    iVar6 = 1;
    uVar7 = 0;
    iVar8 = iVar3;
    do {
      if (ppCVar2 == ppCVar1) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",lVar5
                  );
        goto LAB_0011f2a8;
      }
      iVar3 = (int)ppCVar1[uVar7]->m_pPointE->m_cZ;
      if (iVar6 <= iVar3) {
        iVar6 = iVar3;
      }
      if (iVar8 < iVar3) {
        iVar3 = iVar8;
      }
      uVar7 = uVar7 + 1;
      iVar8 = iVar3;
    } while ((uVar4 & 0x7fffffff) != uVar7);
  }
  return (double)((iVar6 - iVar3) + 1);
}

Assistant:

double CWire::GetSegmentListCost(vector<CSegment*>* pSegmentList)
{
	assert(pSegmentList);

	// via cost [2/10/2007 thyeros]
	int	iMaxZ	=	LAYER_METAL1;
	int	iMinZ	=	GetDesign()->T();

	for(int i=0,s=pSegmentList->size();i<s;++i)
	{
		iMaxZ	=	MAX(iMaxZ,pSegmentList->at(i)->m_pPointE->Z());
		iMinZ	=	MIN(iMinZ,pSegmentList->at(i)->m_pPointE->Z());
	}

	return	iMaxZ-iMinZ+1;
}